

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_replaceRangeCString_success_indexAndRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 4;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x1389ee;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"0123",5);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x138a37;
  bVar1 = AString_replaceRangeCString(&string,4,0x29a,"45",2);
  if (bVar1 == false) {
    pcVar4 = "Assertion \'AString_replaceRangeCString(&string, 4, 666, \"45\", 2)\' failed";
    iVar2 = 0x632;
LAB_00138d69:
    uStack_50 = 0x138d75;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar4,0,0);
  }
  uStack_50 = 0x138a50;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x632);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar8 = "(string).capacity";
    iVar2 = 0x633;
    pcVar4 = (char *)string.capacity;
LAB_00138e70:
    local_58 = (char *)0x8;
LAB_00138e76:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_60;
    goto LAB_00138e78;
  }
  uStack_50 = 0x138a70;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x633);
  if (string.buffer == (char *)0x0) {
    ppcVar7 = &local_58;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar2 = 0x633;
    goto LAB_00138ec3;
  }
  uStack_50 = 0x138a8d;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x633);
  pcVar9 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar4 = "";
    pcVar9 = "(null)";
LAB_00138c98:
    local_60 = "012345";
    pcStack_70 = "(\"012345\")";
    pcVar5 = "(string).buffer == (\"012345\")";
    iVar2 = 0x633;
  }
  else {
    uStack_50 = 0x138aaa;
    iVar2 = strcmp("012345",string.buffer);
    if (iVar2 != 0) {
      pcVar4 = "\"";
      goto LAB_00138c98;
    }
    uStack_50 = 0x138ac3;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x633);
    if (string.size != 6) {
      local_60 = "strlen(\"012345\")";
      pcVar5 = "(string).size == strlen(\"012345\")";
      pcVar8 = "(string).size";
      iVar2 = 0x633;
      local_58 = (char *)0x6;
      pcVar4 = (char *)string.size;
      goto LAB_00138e76;
    }
    uStack_50 = 0x138ae3;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x633);
    if (private_ACUtilsTest_AString_reallocCount != 0) {
      ppcVar7 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar9 = "private_ACUtilsTest_AString_reallocCount";
      iVar2 = 0x634;
LAB_00138ec3:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) =
           test_AString_replaceRangeCString_success_indexAndRangeBeyondSize_bufferExpanded_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x138b04;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x634);
    uStack_50 = 0x138b23;
    bVar1 = AString_replaceRangeCString(&string,0x29a,0x2a,"67",2);
    if (bVar1 == false) {
      pcVar4 = "Assertion \'AString_replaceRangeCString(&string, 666, 42, \"67\", 2)\' failed";
      iVar2 = 0x635;
      goto LAB_00138d69;
    }
    uStack_50 = 0x138b3c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x635);
    if (string.capacity != 8) {
      local_60 = "(8)";
      pcVar5 = "(string).capacity == (8)";
      pcVar8 = "(string).capacity";
      pcVar4 = (char *)string.capacity;
LAB_00138e6b:
      iVar2 = 0x636;
      goto LAB_00138e70;
    }
    uStack_50 = 0x138b5c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x636);
    if (string.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar2 = 0x636;
      goto LAB_00138ec3;
    }
    uStack_50 = 0x138b79;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x636);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar4 = "";
    }
    else {
      uStack_50 = 0x138b96;
      iVar2 = strcmp("01234567",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x138baf;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x636);
        if (string.size == 8) {
          uStack_50 = 0x138bcf;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x636);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x138bf0;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x637);
            uStack_50 = 0x138bf9;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            return;
          }
          ppcVar7 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x637;
          goto LAB_00138ec3;
        }
        local_60 = "strlen(\"01234567\")";
        pcVar5 = "(string).size == strlen(\"01234567\")";
        pcVar8 = "(string).size";
        pcVar4 = (char *)string.size;
        goto LAB_00138e6b;
      }
      pcVar4 = "\"";
    }
    local_60 = "01234567";
    pcStack_70 = "(\"01234567\")";
    pcVar5 = "(string).buffer == (\"01234567\")";
    iVar2 = 0x636;
  }
  pcVar8 = "(string).buffer";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar6 = &pcStack_80;
  pcStack_80 = pcVar9;
  pcStack_78 = pcVar4;
LAB_00138e78:
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x138e7f;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeCString_success_indexAndRangeBeyondSize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("0123", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 4, 666, "45", 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012345", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 666, 42, "67", 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}